

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

ssize_t __thiscall AutoFile::write(AutoFile *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  FILE *__s;
  pointer pbVar2;
  ulong uVar3;
  void *pvVar4;
  char *pcVar5;
  ulong uVar6;
  ptrdiff_t _Num;
  void *__n_00;
  undefined4 in_register_00000034;
  ulong uVar7;
  void *pvVar8;
  long in_FS_OFFSET;
  array<std::byte,_4096UL> buf;
  
  pvVar8 = (void *)CONCAT44(in_register_00000034,__fd);
  buf._M_elems[8] = 0;
  buf._M_elems[9] = 0;
  buf._M_elems[10] = 0;
  buf._M_elems[0xb] = 0;
  buf._M_elems[0xc] = 0;
  buf._M_elems[0xd] = 0;
  buf._M_elems[0xe] = 0;
  buf._M_elems[0xf] = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = (FILE *)this->m_file;
  if (__s == (FILE *)0x0) {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    buf._M_elems._8_8_ = std::iostream_category();
    buf._M_elems[0] = 1;
    buf._M_elems[1] = 0;
    buf._M_elems[2] = 0;
    buf._M_elems[3] = 0;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar5,(error_code *)"AutoFile::write: file handle is nullptr");
LAB_0077a3cb:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    if ((this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar8 = (void *)fwrite(pvVar8,1,(size_t)__buf,__s);
      if (pvVar8 != __buf) {
        pcVar5 = (char *)__cxa_allocate_exception(0x20);
        buf._M_elems._8_8_ = std::iostream_category();
        buf._M_elems[0] = 1;
        buf._M_elems[1] = 0;
        buf._M_elems[2] = 0;
        buf._M_elems[3] = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar5,(error_code *)"AutoFile::write: write failed");
        goto LAB_0077a3cb;
      }
    }
    else {
      uVar3 = ftell(__s);
      if ((long)uVar3 < 0) {
        pcVar5 = (char *)__cxa_allocate_exception(0x20);
        buf._M_elems._8_8_ = std::iostream_category();
        buf._M_elems[0] = 1;
        buf._M_elems[1] = 0;
        buf._M_elems[2] = 0;
        buf._M_elems[3] = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar5,(error_code *)"AutoFile::write: ftell failed");
        goto LAB_0077a3cb;
      }
      if (__buf != (void *)0x0) {
        do {
          __n_00 = (void *)0x1000;
          if (__buf < (void *)0x1000) {
            __n_00 = __buf;
          }
          memcpy(&buf,pvVar8,(size_t)__n_00);
          pbVar2 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = (long)(this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
          if (uVar7 != 0) {
            uVar6 = uVar3 % uVar7;
            pvVar4 = (void *)0x0;
            do {
              buf._M_elems[(long)pvVar4] = buf._M_elems[(long)pvVar4] ^ pbVar2[uVar6];
              uVar6 = uVar6 + 1;
              if (uVar6 == uVar7) {
                uVar6 = 0;
              }
              pvVar4 = (void *)((long)pvVar4 + 1);
            } while (__n_00 != pvVar4);
          }
          pvVar4 = (void *)fwrite(&buf,1,(size_t)__n_00,(FILE *)this->m_file);
          if (pvVar4 != __n_00) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::iostream_category();
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"XorFile::write: failed");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0077a439;
          }
          pvVar8 = (void *)((long)pvVar8 + (long)__n_00);
          uVar3 = uVar3 + (long)__n_00;
          __buf = (void *)((long)__buf - (long)__n_00);
        } while (__buf != (void *)0x0);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
LAB_0077a439:
  __stack_chk_fail();
}

Assistant:

void AutoFile::write(Span<const std::byte> src)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::write: file handle is nullptr");
    if (m_xor.empty()) {
        if (std::fwrite(src.data(), 1, src.size(), m_file) != src.size()) {
            throw std::ios_base::failure("AutoFile::write: write failed");
        }
    } else {
        auto current_pos{std::ftell(m_file)};
        if (current_pos < 0) throw std::ios_base::failure("AutoFile::write: ftell failed");
        std::array<std::byte, 4096> buf;
        while (src.size() > 0) {
            auto buf_now{Span{buf}.first(std::min<size_t>(src.size(), buf.size()))};
            std::copy(src.begin(), src.begin() + buf_now.size(), buf_now.begin());
            util::Xor(buf_now, m_xor, current_pos);
            if (std::fwrite(buf_now.data(), 1, buf_now.size(), m_file) != buf_now.size()) {
                throw std::ios_base::failure{"XorFile::write: failed"};
            }
            src = src.subspan(buf_now.size());
            current_pos += buf_now.size();
        }
    }
}